

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-full.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  bool doRecord;
  AudioLogger audioLogger;
  Parameters parameters;
  size_t totalSize_bytes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  ofstream fout;
  char local_2e5;
  int local_2e4;
  AudioLogger local_2e0;
  _Any_data local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 local_2a0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  undefined8 local_278;
  timespec local_270;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  printf("Usage: %s output.kbd [-cN]\n",*argv);
  puts("    -cN - select capture device N");
  puts("    -CN - number N of capture channels N");
  putchar(10);
  if (argc < 2) {
    return -0x7f;
  }
  parseCmdArguments_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_260,argc,argv);
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_260,(key_type *)local_230);
  lVar6 = 0;
  if (pmVar4->_M_string_length == 0) {
LAB_00112509:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    local_230._0_8_ = &local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"C","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_260,(key_type *)local_230);
    lVar7 = 0;
    if (pmVar4->_M_string_length == 0) {
LAB_0011261e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._0_8_ != &local_220) {
        operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
      }
      local_2e5 = '\x01';
      local_278 = 0;
      std::ofstream::ofstream(local_230,argv[1],_S_bin);
      if (*(int *)((long)aiStack_210 + *(long *)(local_230._0_8_ + -0x18)) != 0) {
        main_cold_1();
LAB_001127a1:
        local_230._0_8_ = _VTT;
        *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _SDL_GetNumAudioDevices;
        std::filebuf::~filebuf((filebuf *)(local_230 + 8));
        std::ios_base::~ios_base(local_138);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_260);
        return -1;
      }
      AudioLogger::AudioLogger(&local_2e0);
      local_298._8_8_ = 0;
      local_298._M_unused._M_object = operator_new(0x18);
      *(char **)local_298._M_unused._0_8_ = &local_2e5;
      *(undefined8 **)((long)local_298._M_unused._0_8_ + 8) = &local_278;
      *(undefined1 **)((long)local_298._M_unused._0_8_ + 0x10) = local_230;
      local_280 = std::
                  _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record-full.cpp:40:37)>
                  ::_M_invoke;
      local_288 = std::
                  _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record-full.cpp:40:37)>
                  ::_M_manager;
      local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   )0x0;
      local_2d8 = (_Any_data)0x0;
      local_2b8 = 0xffffffff;
      uStack_2b4 = 0xffffffff;
      uStack_2b0 = 0xffffffffffffffff;
      local_2a8 = 0;
      uStack_2a4 = 1;
      local_2a0 = 0x447a0000;
      std::
      function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
      ::operator=((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                   *)&local_2d8,
                  (function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                   *)&local_298);
      local_2b8 = (undefined4)lVar6;
      uStack_2b4 = (undefined4)lVar7;
      uStack_2b0 = 16000;
      uStack_2a4 = 0;
      local_2a0 = 0x42c80000;
      bVar2 = AudioLogger::install(&local_2e0,(Parameters *)&local_2d8);
      if (!bVar2) {
        fwrite("Failed to install audio logger\n",0x1f,1,_stderr);
        if ((code *)local_2c8._M_allocated_capacity != (code *)0x0) {
          (*(code *)local_2c8._M_allocated_capacity)(&local_2d8,&local_2d8,3);
        }
        if (local_288 != (code *)0x0) {
          (*local_288)(&local_298,&local_298,__destroy_functor);
        }
        AudioLogger::~AudioLogger(&local_2e0);
        goto LAB_001127a1;
      }
      goto LAB_00112820;
    }
    local_2d8._M_unused._M_object = &local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"C","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_260,(key_type *)&local_2d8);
    plVar1 = (long *)(pmVar4->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    local_2e4 = *piVar5;
    *piVar5 = 0;
    lVar7 = strtol((char *)plVar1,(char **)&local_298,10);
    if ((long *)local_298._M_unused._0_8_ == plVar1) goto LAB_00112808;
    if (((int)lVar7 == lVar7) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = local_2e4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_unused._0_8_ != &local_2c8) {
        operator_delete(local_2d8._M_unused._M_object,local_2c8._M_allocated_capacity + 1);
      }
      goto LAB_0011261e;
    }
  }
  else {
    local_2d8._M_unused._M_object = &local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"c","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_260,(key_type *)&local_2d8);
    plVar1 = (long *)(pmVar4->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol((char *)plVar1,(char **)&local_298,10);
    if ((long *)local_298._M_unused._0_8_ == plVar1) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)lVar6 == lVar6) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = iVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_unused._0_8_ != &local_2c8) {
        operator_delete(local_2d8._M_unused._M_object,local_2c8._M_allocated_capacity + 1);
      }
      goto LAB_00112509;
    }
    std::__throw_out_of_range("stoi");
LAB_00112808:
    std::__throw_invalid_argument("stoi");
  }
  std::__throw_out_of_range("stoi");
LAB_00112820:
  do {
    while (local_2e5 == '\x01') {
      local_2e5 = '\0';
      AudioLogger::record(&local_2e0,0.5,0);
    }
    local_270.tv_sec = 0;
    local_270.tv_nsec = 1000000;
    do {
      iVar3 = nanosleep(&local_270,&local_270);
      if (iVar3 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s output.kbd [-cN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -CN - number N of capture channels N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int nChannels = argm["C"].empty() ? 0 : std::stoi(argm["C"]);

    bool doRecord = true;
    size_t totalSize_bytes = 0;

    std::ofstream fout(argv[1], std::ios::binary);
    if (fout.good() == false) {
        fprintf(stderr, "Failed to open file '%s'\n", argv[1]);
        return -1;
    }

    AudioLogger audioLogger;
    AudioLogger::Callback cbAudio = [&](const auto & frames) {
        doRecord = true;

        for (const auto & frame : frames) {
            totalSize_bytes += sizeof(frame[0])*frame.size();
            fout.write((char *)(frame.data()), sizeof(frame[0])*frame.size());
            fout.flush();
        }

        printf("Total data saved: %g MB\n", ((float)(totalSize_bytes)/1024.0f/1024.0f));
    };

    AudioLogger::Parameters parameters;
    parameters.callback = std::move(cbAudio);
    parameters.captureId = captureId;
    parameters.nChannels = nChannels;
    parameters.sampleRate = kSampleRate;
    parameters.filter = EAudioFilter::None;
    parameters.freqCutoff_Hz = kFreqCutoff_Hz;

    if (audioLogger.install(std::move(parameters)) == false) {
        fprintf(stderr, "Failed to install audio logger\n");
        return -1;
    }

    while (true) {
        if (doRecord) {
            doRecord = false;
            audioLogger.record(0.5f, 0);
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(1));
        }
    }

    return 0;
}